

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O2

bool __thiscall
glcts::TessellationShaderMaxPatchVertices::compareResults
          (TessellationShaderMaxPatchVertices *this,char *description,GLfloat *ref_fv)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  float *value;
  MessageBuilder *pMVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  value = (float *)(**(code **)(lVar5 + 0xd00))(0x8c8e,0,0x20,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glMapBufferRange(floats) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x296);
  uVar2 = 0;
  do {
    uVar7 = uVar2;
    if (uVar7 == 4) goto LAB_00d09b35;
    fVar8 = value[uVar7] - ref_fv[uVar7];
    fVar9 = -fVar8;
    if (-fVar8 <= fVar8) {
      fVar9 = fVar8;
    }
    uVar2 = uVar7 + 1;
  } while (fVar9 <= 1e-05);
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,description);
  std::operator<<((ostream *)this_00," captured results ");
  std::operator<<((ostream *)this_00,"vec4(");
  pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 1);
  std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 2);
  std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 3);
  poVar1 = &pMVar6->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,") ");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "are different from the expected values ");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"vec4(");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,ref_fv);
  std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,ref_fv + 1);
  std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,ref_fv + 2);
  std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,ref_fv + 3);
  std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
LAB_00d09b35:
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUnmapBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2af);
  return 3 < uVar7;
}

Assistant:

bool TessellationShaderMaxPatchVertices::compareResults(const char* description, glw::GLfloat ref_fv[4])
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	const glw::GLfloat*   resultFloats = DE_NULL;

	resultFloats = (const glw::GLfloat*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
		(sizeof(glw::GLfloat) /* GLfloat size */ * 4 /* components */ * OUTPUT_VERTEX_COUNT), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange(floats) failed");

	/* Comparison of vec4. */
	const glw::GLfloat epsilon	 = (glw::GLfloat)1e-5f;
	bool			   test_failed = false;

	for (int i = 0; i < 4 /* components */; i++)
	{
		if (de::abs(resultFloats[i] - ref_fv[i]) > epsilon)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

			m_testCtx.getLog() << tcu::TestLog::Message << description << " captured results "
							   << "vec4(" << resultFloats[0] << ", " << resultFloats[1] << ", " << resultFloats[2]
							   << ", " << resultFloats[3] << ") "
							   << "are different from the expected values "
							   << "vec4(" << ref_fv[0] << ", " << ref_fv[1] << ", " << ref_fv[2] << ", " << ref_fv[3]
							   << ")." << tcu::TestLog::EndMessage;

			test_failed = true;
			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed!");

	return !test_failed;
}